

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  int iVar1;
  int extraout_var;
  int extraout_var_00;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  char *beg;
  char byte;
  char buf [2048];
  char local_881;
  Stream *local_880;
  char *local_878;
  long local_870;
  ulong local_868;
  char *local_860;
  ulong local_858;
  char local_850;
  undefined7 uStack_84f;
  anon_class_8_1_b2c1a266 local_840;
  char local_838 [2056];
  long lVar2;
  
  local_878 = local_838;
  local_870 = 0x800;
  local_850 = '\0';
  local_880 = strm;
  local_860 = &local_850;
  local_840.headers = headers;
  while( true ) {
    local_868 = 0;
    local_858 = 0;
    *local_860 = '\0';
    iVar1 = (*local_880->_vptr_Stream[4])(local_880,&local_881,1);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if (extraout_var < 0) break;
    lVar5 = 0;
    while (lVar2 != 0) {
      if (local_868 < local_870 - 1U) {
        local_878[local_868] = local_881;
        local_878[local_868 + 1] = '\0';
        local_868 = local_868 + 1;
      }
      else {
        if (local_858 == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_860,0,(char *)0x0,(ulong)local_878);
        }
        std::__cxx11::string::push_back((char)&local_860);
      }
      if (local_881 == '\n') goto LAB_0011c139;
      iVar1 = (*local_880->_vptr_Stream[4])(local_880,&local_881,1);
      lVar2 = CONCAT44(extraout_var_00,iVar1);
      lVar5 = lVar5 + -1;
      if (extraout_var_00 < 0) goto LAB_0011c19e;
    }
    if (lVar5 == 0) break;
LAB_0011c139:
    uVar3 = local_858;
    beg = local_860;
    if (local_858 == 0) {
      uVar3 = local_868;
      beg = local_878;
    }
    if (((1 < uVar3) && (beg[uVar3 - 2] == '\r')) && (beg[uVar3 - 1] == '\n')) {
      if (uVar3 == 2) {
        bVar4 = true;
        goto LAB_0011c1a0;
      }
      if (0x2000 < uVar3) break;
      parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                (beg,beg + (uVar3 - 2),local_840);
    }
  }
LAB_0011c19e:
  bVar4 = false;
LAB_0011c1a0:
  if (local_860 != &local_850) {
    operator_delete(local_860,CONCAT71(uStack_84f,local_850) + 1);
  }
  return bVar4;
}

Assistant:

inline bool read_headers(Stream& strm, Headers& headers) {
            const auto bufsiz = 2048;
            char buf[bufsiz];
            stream_line_reader line_reader(strm, buf, bufsiz);

            for (;;) {
                if (!line_reader.getline()) { return false; }

                // Check if the line ends with CRLF.
                auto line_terminator_len = 2;
                if (line_reader.end_with_crlf()) {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 2) { break; }
                #ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
                } else {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 1) { break; }
                    line_terminator_len = 1;
                }
            #else
            } else {
                    continue; // Skip invalid line.
                }